

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O3

bool __thiscall
embree::TokenStream::tryIdentifier(TokenStream *this,Token *token,ParseLocation *loc)

{
  uint uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint *puVar4;
  bool bVar5;
  string str;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  char local_58 [16];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  ssize_t local_38;
  ssize_t sStack_30;
  
  local_a8 = 0;
  local_a0[0] = 0;
  local_b0 = local_a0;
  puVar4 = (uint *)Stream<int>::peek((this->cin).ptr);
  if (((ulong)*puVar4 < 0x100) && (this->isAlphaMap[*puVar4] != false)) {
    Stream<int>::get((this->cin).ptr);
    std::__cxx11::string::push_back((char)&local_b0);
    while( true ) {
      puVar4 = (uint *)Stream<int>::peek((this->cin).ptr);
      uVar1 = *puVar4;
      if ((0xff < (ulong)uVar1) || ((uVar1 - 0x30 < 10 | this->isAlphaMap[uVar1]) != 1)) break;
      Stream<int>::get((this->cin).ptr);
      std::__cxx11::string::push_back((char)&local_b0);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_b0,local_b0 + local_a8);
    Token::Token((Token *)local_70,&local_90,TY_IDENTIFIER,loc);
    token->ty = local_70._0_4_;
    token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)local_70._4_4_;
    std::__cxx11::string::operator=((string *)&token->str,(string *)&local_68);
    _Var3._M_pi = _Stack_40._M_pi;
    peVar2 = local_48;
    local_48 = (element_type *)0x0;
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (token->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var3._M_pi;
    if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (token->loc).lineNumber = local_38;
      (token->loc).colNumber = sStack_30;
    }
    else {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      (token->loc).lineNumber = local_38;
      (token->loc).colNumber = sStack_30;
      if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
      }
    }
    if (local_68._M_p != local_58) {
      operator_delete(local_68._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  return bVar5;
}

Assistant:

bool TokenStream::tryIdentifier(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (!isAlpha(cin->peek())) return false;
    str += (char)cin->get();
    while (isAlphaNum(cin->peek())) str += (char)cin->get();
    token = Token(str,Token::TY_IDENTIFIER,loc);
    return true;
  }